

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O2

int xmlRelaxNGCompareElemDefLists
              (xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict *def1,
              xmlRelaxNGDefinePtr_conflict *def2)

{
  xmlRelaxNGValidityErrorFunc *pp_Var1;
  int iVar2;
  xmlRelaxNGValidityErrorFunc p_Var3;
  xmlRelaxNGDefinePtr_conflict *ppxVar4;
  
  if (((def1 != (xmlRelaxNGDefinePtr_conflict *)0x0 && ctxt != (xmlRelaxNGParserCtxtPtr)0x0) &&
      (p_Var3 = (xmlRelaxNGValidityErrorFunc)ctxt->userData,
      p_Var3 != (xmlRelaxNGValidityErrorFunc)0x0)) && (*def1 != (xmlRelaxNGDefinePtr_conflict)0x0))
  {
    while (ppxVar4 = def1, p_Var3 != (xmlRelaxNGValidityErrorFunc)0x0) {
      while (*ppxVar4 != (xmlRelaxNGDefinePtr_conflict)0x0) {
        iVar2 = xmlRelaxNGCompareNameClasses((xmlRelaxNGDefinePtr_conflict)ctxt->userData,*ppxVar4);
        ppxVar4 = ppxVar4 + 1;
        if (iVar2 == 0) {
          return 0;
        }
      }
      pp_Var1 = &ctxt->error;
      ctxt = (xmlRelaxNGParserCtxtPtr)&ctxt->error;
      p_Var3 = *pp_Var1;
    }
  }
  return 1;
}

Assistant:

static int
xmlRelaxNGCompareElemDefLists(xmlRelaxNGParserCtxtPtr ctxt
                              ATTRIBUTE_UNUSED, xmlRelaxNGDefinePtr * def1,
                              xmlRelaxNGDefinePtr * def2)
{
    xmlRelaxNGDefinePtr *basedef2 = def2;

    if ((def1 == NULL) || (def2 == NULL))
        return (1);
    if ((*def1 == NULL) || (*def2 == NULL))
        return (1);
    while (*def1 != NULL) {
        while ((*def2) != NULL) {
            if (xmlRelaxNGCompareNameClasses(*def1, *def2) == 0)
                return (0);
            def2++;
        }
        def2 = basedef2;
        def1++;
    }
    return (1);
}